

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player_mike_3.h
# Opt level: O0

void __thiscall PlayerMike_3::~PlayerMike_3(PlayerMike_3 *this)

{
  undefined8 *in_RDI;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  
  *in_RDI = &PTR__PlayerMike_3_0011bbc0;
  std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  Player::~Player((Player *)0x1091b4);
  return;
}

Assistant:

PlayerMike_3(const std::string& name) :
      Player(name),
      m_predict(27)
   {}